

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::LocateObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,CPalString *psObjectToLocate,
          CAllowedObjectTypes *paot,IPalObject **ppobj)

{
  IPalObject **ppIVar1;
  bool bVar2;
  int iVar3;
  PAL_ERROR PVar4;
  size_t sVar5;
  CSharedMemoryObject *pCVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SHMPTR shmptr;
  SHMObjData *psmod;
  char16_t *string1;
  PLIST_ENTRY ple;
  char *__format;
  WCHAR *string;
  CObjectAttributes local_78;
  PCRITICAL_SECTION local_60;
  CSharedMemoryObjectManager *local_58;
  CSharedMemoryObject *local_50;
  CSharedMemoryObject *pshmobj;
  IPalObject **local_40;
  CAllowedObjectTypes *local_38;
  undefined8 *puVar7;
  
  local_38 = paot;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x202);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (psObjectToLocate == (CPalString *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x203);
    fprintf(_stderr,"Expression: NULL != psObjectToLocate\n");
  }
  string = psObjectToLocate->m_pwsz;
  if (string == (WCHAR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x204);
    fprintf(_stderr,"Expression: NULL != psObjectToLocate->GetString()\n");
    string = psObjectToLocate->m_pwsz;
  }
  sVar5 = PAL_wcslen(string);
  if (sVar5 != psObjectToLocate->m_dwStringLength) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x205);
    fprintf(_stderr,
            "Expression: PAL_wcslen(psObjectToLocate->GetString()) == psObjectToLocate->GetStringLength()\n"
           );
  }
  if (ppobj == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x206);
    fprintf(_stderr,"Expression: NULL != ppobj\n");
  }
  local_40 = ppobj;
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d6931;
  local_60 = &this->m_csListLock;
  pshmobj = (CSharedMemoryObject *)pthr;
  InternalEnterCriticalSection(pthr,local_60);
  ple = &this->m_leNamedObjects;
  local_58 = this;
  do {
    ple = ple->Flink;
    if (ple == &this->m_leNamedObjects) {
      pCVar6 = (CSharedMemoryObject *)0x0;
      break;
    }
    pCVar6 = CSharedMemoryObject::GetObjectFromListLink(ple);
    iVar3 = (*(pCVar6->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[1])(pCVar6);
    puVar7 = (undefined8 *)CONCAT44(extraout_var,iVar3);
    if (puVar7 == (undefined8 *)0x0) {
      fprintf(_stderr,"] %s %s:%d","LocateObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x223);
      fprintf(_stderr,"Expression: NULL != poa\n");
    }
  } while ((*(DWORD *)(puVar7 + 1) != psObjectToLocate->m_dwStringLength) ||
          (iVar3 = PAL_wcscmp((char16_t *)*puVar7,psObjectToLocate->m_pwsz), iVar3 != 0));
  ppIVar1 = local_40;
  if (pCVar6 == (CSharedMemoryObject *)0x0) {
    SHMLock();
    shmptr = SHMGetInfo(SIID_NAMED_OBJECTS);
    PVar4 = 0x7b;
    while (shmptr != 0) {
      psmod = (SHMObjData *)SHMPtrToPtr(shmptr);
      if (psmod == (SHMObjData *)0x0) {
        fprintf(_stderr,"] %s %s:%d","LocateObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x279);
        __format = "Unable to map shmObjectListEntry\n";
LAB_001d6860:
        fprintf(_stderr,__format);
        break;
      }
      if (psmod->dwNameLength == psObjectToLocate->m_dwStringLength) {
        string1 = (char16_t *)SHMPtrToPtr(psmod->shmObjName);
        if (string1 == (char16_t *)0x0) {
          fprintf(_stderr,"] %s %s:%d","LocateObject",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x270);
          __format = "Unable to map psmod->shmObjName\n";
          goto LAB_001d6860;
        }
        iVar3 = PAL_wcscmp(string1,psObjectToLocate->m_pwsz);
        if (iVar3 == 0) {
          local_50 = (CSharedMemoryObject *)0x0;
          local_78.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
          sVar5 = PAL_wcslen(string1);
          local_78.sObjectName.m_dwStringLength = (DWORD)sVar5;
          local_78.sObjectName.m_dwMaxLength = local_78.sObjectName.m_dwStringLength + 1;
          local_78.sObjectName.m_pwsz = string1;
          bVar2 = CAllowedObjectTypes::IsTypeAllowed(local_38,psmod->eTypeId);
          if (bVar2) {
            if (CObjectType::s_rgotIdMapping[psmod->eTypeId] == (CObjectType *)0x0) {
              PVar4 = 0;
              fprintf(_stderr,"] %s %s:%d","LocateObject",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                      ,0x295);
              fprintf(_stderr,"Invalid object type ID in shared memory info\n");
              break;
            }
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d6931;
            PVar4 = ImportSharedObjectIntoProcess
                              (local_58,(CPalThread *)pshmobj,
                               CObjectType::s_rgotIdMapping[psmod->eTypeId],&local_78,shmptr,psmod,
                               true,&local_50);
            if (PVar4 == 0) {
              *local_40 = (IPalObject *)local_50;
              PVar4 = 0;
              break;
            }
          }
          else {
            PVar4 = 6;
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d6931;
          break;
        }
      }
      shmptr = psmod->shmNextObj;
    }
    SHMRelease();
  }
  else {
    iVar3 = (**(pCVar6->super_CPalObjectBase).super_IPalObject._vptr_IPalObject)(pCVar6);
    bVar2 = CAllowedObjectTypes::IsTypeAllowed
                      (local_38,*(PalObjectTypeId *)CONCAT44(extraout_var_00,iVar3));
    if (bVar2) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d6931;
      (*(pCVar6->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[7])(pCVar6);
      *ppIVar1 = (IPalObject *)pCVar6;
      PVar4 = 0;
    }
    else {
      PVar4 = 6;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d6931;
    }
  }
  InternalLeaveCriticalSection((CPalThread *)pshmobj,local_60);
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar4;
  }
LAB_001d6931:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::LocateObject(
    CPalThread *pthr,
    CPalString *psObjectToLocate,
    CAllowedObjectTypes *paot,
    IPalObject **ppobj               // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjExisting = NULL;
    SHMPTR shmSharedObjectData = SHMNULL;
    SHMPTR shmObjectListEntry = SHMNULL;
    SHMObjData *psmod = NULL;
    LPWSTR pwsz = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != psObjectToLocate);
    _ASSERTE(NULL != psObjectToLocate->GetString());
    _ASSERTE(PAL_wcslen(psObjectToLocate->GetString()) == psObjectToLocate->GetStringLength());
    _ASSERTE(NULL != ppobj);

    ENTRY("CSharedMemoryObjectManager::LocateObject "
        "(this=%p, pthr=%p, psObjectToLocate=%p, paot=%p, "
        "ppobj=%p)\n",
        this,
        pthr,
        psObjectToLocate,
        paot,
        ppobj
        );

    TRACE("Searching for object name %S\n", psObjectToLocate->GetString());

    InternalEnterCriticalSection(pthr, &m_csListLock);

    //
    // Search the local named object list for this object
    //

    for (PLIST_ENTRY ple = m_leNamedObjects.Flink;
         ple != &m_leNamedObjects;
         ple = ple->Flink)
    {
        CObjectAttributes *poa;
        CSharedMemoryObject *pshmobj =
            CSharedMemoryObject::GetObjectFromListLink(ple);

        poa = pshmobj->GetObjectAttributes();
        _ASSERTE(NULL != poa);

        if (poa->sObjectName.GetStringLength() != psObjectToLocate->GetStringLength())
        {
            continue;
        }

        if (0 != PAL_wcscmp(poa->sObjectName.GetString(), psObjectToLocate->GetString()))
        {
            continue;
        }

        //
        // This object has the name we're looking for
        //

        pobjExisting = static_cast<IPalObject*>(pshmobj);
        break;        
    } 

    if (NULL != pobjExisting)
    {
        //
        //  Validate the located object's type
        //

        if (paot->IsTypeAllowed(
                pobjExisting->GetObjectType()->GetId()
                ))
        {
            TRACE("Local object exists with compatible type\n");
            
            //
            // Add a reference to the found object
            //

            pobjExisting->AddReference();
            *ppobj = pobjExisting;
        }
        else
        {
            TRACE("Local object exists w/ incompatible type\n");            
            palError = ERROR_INVALID_HANDLE;
        }
        
        goto LocateObjectExit;
    }

    //
    // Search the shared memory named object list for a matching object
    //
    
    SHMLock();
    
    shmObjectListEntry = SHMGetInfo(SIID_NAMED_OBJECTS);
    while (SHMNULL != shmObjectListEntry)
    {
        psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, shmObjectListEntry);
        if (NULL != psmod)
        {
            if (psmod->dwNameLength == psObjectToLocate->GetStringLength())
            {
                pwsz = SHMPTR_TO_TYPED_PTR(WCHAR, psmod->shmObjName);
                if (NULL != pwsz)
                {
                    if (0 == PAL_wcscmp(pwsz, psObjectToLocate->GetString()))
                    {
                        //
                        // This is the object we were looking for.
                        //

                        shmSharedObjectData = shmObjectListEntry;
                        break;
                    }
                }
                else
                {
                    ASSERT("Unable to map psmod->shmObjName\n");
                    break;
                }                
            }

            shmObjectListEntry = psmod->shmNextObj;
        }
        else
        {
            ASSERT("Unable to map shmObjectListEntry\n");
            break;
        }
    }

    if (SHMNULL != shmSharedObjectData)
    {
        CSharedMemoryObject *pshmobj = NULL;
        CObjectAttributes oa(pwsz, NULL);

        //
        // Check if the type is allowed
        //

        if (!paot->IsTypeAllowed(psmod->eTypeId))
        {
            TRACE("Remote object exists w/ incompatible type\n");
            palError = ERROR_INVALID_HANDLE;
            goto LocateObjectExitSHMRelease;
        }
        
        //
        // Get the local instance of the CObjectType
        //
        
        CObjectType *pot = CObjectType::GetObjectTypeById(psmod->eTypeId);
        if (NULL == pot)
        {
            ASSERT("Invalid object type ID in shared memory info\n");
            goto LocateObjectExitSHMRelease;
        }

        TRACE("Remote object exists compatible type -- importing\n");
        
        //
        // Create the local state for the shared object
        //

        palError = ImportSharedObjectIntoProcess(
            pthr,
            pot,
            &oa,
            shmSharedObjectData,
            psmod,
            TRUE,
            &pshmobj
            );

        if (NO_ERROR == palError)
        {   
            *ppobj = static_cast<IPalObject*>(pshmobj);
        }
        else
        {
            ERROR("Failure initializing object from shared data\n");
            goto LocateObjectExitSHMRelease;
        }
        
    }
    else
    {
        //
        // The object was not found
        //

        palError = ERROR_INVALID_NAME;
    }

LocateObjectExitSHMRelease:

    SHMRelease();

LocateObjectExit:

    InternalLeaveCriticalSection(pthr, &m_csListLock);

    LOGEXIT("CSharedMemoryObjectManager::LocateObject returns %d\n", palError);

    return palError;
}